

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O0

void __thiscall
Fifteen::moveNumericTile(Fifteen *this,size_t rowSrc,size_t colSrc,size_t rowDst,size_t colDst)

{
  pointer this_00;
  reference pvVar1;
  pointer pQVar2;
  key_type local_9c;
  QString local_98;
  QString local_70;
  __tuple_element_t<1UL,_tuple<unsigned_long,_unsigned_long>_> *local_58;
  type *_;
  type *boardSize;
  _Head_base<0UL,_UndoMove_*,_false> local_38;
  vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
  *tiles;
  size_t colDst_local;
  size_t rowDst_local;
  size_t colSrc_local;
  size_t rowSrc_local;
  Fifteen *this_local;
  
  tiles = (vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           *)colDst;
  colDst_local = rowDst;
  rowDst_local = colSrc;
  colSrc_local = rowSrc;
  rowSrc_local = (size_t)this;
  this_00 = std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::operator->
                      (&this->tilesBoard);
  local_38._M_head_impl = (UndoMove *)TilesBoard::getTiles(this_00);
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::operator->(&this->controller);
  Controller::getBoardAttributes((Controller *)&boardSize);
  _ = std::get<0ul,unsigned_long,unsigned_long>((tuple<unsigned_long,_unsigned_long> *)&boardSize);
  local_58 = std::get<1ul,unsigned_long,unsigned_long>
                       ((tuple<unsigned_long,_unsigned_long> *)&boardSize);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,
                (size_type)
                ((long)&(tiles->
                        super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + colDst_local * *_));
  pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,colSrc_local * *_ + rowDst_local);
  std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  QAbstractButton::text();
  QAbstractButton::setText((QString *)pQVar2);
  QString::~QString(&local_70);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,
                (size_type)
                ((long)&(tiles->
                        super__Vector_base<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + colDst_local * *_));
  pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  Options::getTileColor();
  QWidget::setStyleSheet((QString *)pQVar2);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,colSrc_local * *_ + rowDst_local);
  pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  QString::QString(&local_98,"");
  QAbstractButton::setText((QString *)pQVar2);
  QString::~QString(&local_98);
  pvVar1 = std::
           vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
           ::at((vector<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>,_std::allocator<std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>_>_>
                 *)local_38._M_head_impl,colSrc_local * *_ + rowDst_local);
  pQVar2 = std::unique_ptr<QPushButton,_std::default_delete<QPushButton>_>::operator->(pvVar1);
  local_9c = EMPTY;
  std::
  map<TileColor,_const_QString,_std::less<TileColor>,_std::allocator<std::pair<const_TileColor,_const_QString>_>_>
  ::at(&Maps::tileColorStyle,&local_9c);
  QWidget::setStyleSheet((QString *)pQVar2);
  return;
}

Assistant:

void Fifteen::moveNumericTile( size_t rowSrc, size_t colSrc, size_t rowDst, size_t colDst )
{
    auto& tiles = tilesBoard->getTiles();
    const auto [ boardSize, _ ] = controller->getBoardAttributes();

    tiles.at( rowDst * boardSize + colDst )->setText( tiles.at( rowSrc * boardSize + colSrc )->text() );
    tiles.at( rowDst * boardSize + colDst )->setStyleSheet( Options::getTileColor() );
    tiles.at( rowSrc * boardSize + colSrc )->setText( "" );
    tiles.at( rowSrc * boardSize + colSrc )->setStyleSheet( Maps::tileColorStyle.at( TileColor::EMPTY ));
}